

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  int64 iVar7;
  undefined4 extraout_var_00;
  MessageLite *pMVar8;
  Extension *extension;
  Extension *local_a8;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  undefined4 extraout_var_01;
  
  bVar2 = MaybeNewExtension(this,*(int *)(descriptor + 0x38),descriptor,&local_a8);
  if (bVar2) {
    TVar3 = FieldDescriptor::type(descriptor);
    local_a8->type = (FieldType)TVar3;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(TVar3 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xa8);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    local_a8->is_repeated = false;
    local_a8->is_packed = false;
    pDVar6 = FieldDescriptor::message_type(descriptor);
    iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
    local_a8->field_0xa = local_a8->field_0xa & 0xf;
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar4),this->arena_);
    (local_a8->field_0).int64_value = iVar7;
    local_a8->field_0xa = local_a8->field_0xa & 0xf0;
    pMVar8 = (MessageLite *)(local_a8->field_0).int64_value;
  }
  else {
    if (local_a8->is_repeated == true) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xb2);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_a8->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xb2);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_99,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = local_a8->field_0xa;
    local_a8->field_0xa = bVar1 & 0xf0;
    pMVar8 = (local_a8->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      pDVar6 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
      iVar4 = (*pMVar8->_vptr_MessageLite[4])(pMVar8,CONCAT44(extraout_var_00,iVar4));
      pMVar8 = (MessageLite *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return pMVar8;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}